

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_wait_for_edge_rising(APITests *this)

{
  Edge EVar1;
  int iVar2;
  long *__nptr;
  bool b;
  long lVar3;
  undefined8 uVar4;
  void *__stat_loc;
  int *unaff_R14;
  future<void> dsc;
  WaitResult result;
  _State_baseV2 *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,0);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  DelayedSetChannel((int)&local_a8,(this->pin_data).out_a,0.5);
  EVar1 = (this->pin_data).in_a;
  __stat_loc = (void *)(ulong)EVar1;
  GPIO::wait_for_edge((int)local_58,EVar1,2,10);
  if (local_a8 == (_State_baseV2 *)0x0) {
    std::__throw_future_error(3);
  }
  else {
    std::__future_base::_State_baseV2::wait(local_a8,__stat_loc);
    __nptr = local_58[0];
    unaff_R14 = __errno_location();
    iVar2 = *unaff_R14;
    *unaff_R14 = 0;
    lVar3 = strtol((char *)__nptr,(char **)&local_38,10);
    if (local_38 != __nptr) {
      if (((int)lVar3 == lVar3) && (*unaff_R14 != 0x22)) {
        if (*unaff_R14 == 0) {
          *unaff_R14 = iVar2;
        }
        iVar2 = (this->pin_data).in_a;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
        assert::is_true(iVar2 == (int)lVar3,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        b = (bool)GPIO::WaitResult::is_event_detected();
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        assert::is_true(b,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        GPIO::cleanup();
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
        }
        return;
      }
      goto LAB_00113c95;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00113c95:
  uVar4 = std::__throw_out_of_range("stoi");
  if ((int *)local_98._M_dataplus._M_p != unaff_R14) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

void test_wait_for_edge_rising()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::LOW);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        auto dsc = DelayedSetChannel(pin_data.out_a, GPIO::HIGH, 0.5);
        auto result = GPIO::wait_for_edge(pin_data.in_a, GPIO::RISING, 10, 1000);
        dsc.wait();
        assert::is_true(std::stoi(result.channel()) == pin_data.in_a);
        assert::is_true(result.is_event_detected());
        GPIO::cleanup();
    }